

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

iterator __thiscall CCoinsViewCache::FetchCoin(CCoinsViewCache *this,COutPoint *outpoint)

{
  byte bVar1;
  long lVar2;
  CCoinsView *pCVar3;
  int iVar4;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> __it;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pVar7 = std::__detail::
          _Insert_base<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::try_emplace<COutPoint_const&>
                    ((_Insert_base<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->cacheCoins,(const_iterator)0x0,outpoint);
  __it._M_cur = (__node_type *)
                pVar7.first.
                super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                _M_cur;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pCVar3 = (this->super_CCoinsViewBacked).base;
    iVar4 = (**pCVar3->_vptr_CCoinsView)(pCVar3,outpoint,(long *)((long)__it._M_cur + 0x48));
    if ((char)iVar4 == '\0') {
      std::
      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->cacheCoins)._M_h,(const_iterator)__it._M_cur);
      __it._M_cur = (__node_type *)0x0;
    }
    else {
      if (*(long *)((long)__it._M_cur + 0x48) == -1) {
        bVar1 = *(byte *)((long)__it._M_cur + 0x40);
        if (bVar1 == 0) {
          *(CoinsCachePair **)((long)__it._M_cur + 0x30) = (this->m_sentinel).second.m_prev;
          *(CoinsCachePair **)((long)__it._M_cur + 0x38) = &this->m_sentinel;
          (this->m_sentinel).second.m_prev = (CoinsCachePair *)((long)__it._M_cur + 8);
          *(CoinsCachePair **)(*(long *)((long)__it._M_cur + 0x30) + 0x30) =
               (CoinsCachePair *)((long)__it._M_cur + 8);
        }
        *(byte *)((long)__it._M_cur + 0x40) = bVar1 | 2;
      }
      uVar6 = (ulong)*(uint *)((long)__it._M_cur + 0x58);
      if (*(uint *)((long)__it._M_cur + 0x6c) < 0x1d) {
        uVar6 = 0;
      }
      uVar5 = 0;
      if ((int)uVar6 != 0) {
        uVar5 = uVar6 + 0x1f & 0xfffffffffffffff0;
      }
      this->cachedCoinsUsage = this->cachedCoinsUsage + uVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (iterator)
           (_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>)__it._M_cur;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsMap::iterator CCoinsViewCache::FetchCoin(const COutPoint &outpoint) const {
    const auto [ret, inserted] = cacheCoins.try_emplace(outpoint);
    if (inserted) {
        if (!base->GetCoin(outpoint, ret->second.coin)) {
            cacheCoins.erase(ret);
            return cacheCoins.end();
        }
        if (ret->second.coin.IsSpent()) {
            // The parent only has an empty entry for this outpoint; we can consider our version as fresh.
            ret->second.AddFlags(CCoinsCacheEntry::FRESH, *ret, m_sentinel);
        }
        cachedCoinsUsage += ret->second.coin.DynamicMemoryUsage();
    }
    return ret;
}